

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O0

void __thiscall Memory::Recycler::VerifyZeroFill(Recycler *this,void *address,size_t size)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined8 *in_FS_OFFSET;
  byte local_21;
  byte expectedFill;
  size_t size_local;
  void *address_local;
  Recycler *this_local;
  
  local_21 = '\0';
  BVar3 = VerifyEnabled(this);
  if (BVar3 != 0) {
    local_21 = 0xca;
  }
  bVar2 = IsAll((byte *)address,size,local_21);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x1e75,"(IsAll((byte *)address, size, expectedFill))",
                       "IsAll((byte *)address, size, expectedFill)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  return;
}

Assistant:

void
Recycler::VerifyZeroFill(void * address, size_t size)
{
    byte expectedFill = 0;
#ifdef RECYCLER_MEMORY_VERIFY
    if (this->VerifyEnabled())
    {
        expectedFill = Recycler::VerifyMemFill;
    }
#endif

    Assert(IsAll((byte *)address, size, expectedFill));
}